

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O1

void __thiscall OpenMD::SC::addType(SC *this,AtomType *atomType)

{
  undefined8 *puVar1;
  size_t sVar2;
  pointer pSVar3;
  long lVar4;
  RealType RVar5;
  double dVar6;
  long lVar7;
  AtomType *atomType2;
  CubicSpline *this_00;
  CubicSpline *this_01;
  int iVar8;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar9;
  RealType r;
  vector<double,_std::allocator<double>_> vvals;
  vector<double,_std::allocator<double>_> rvals;
  int atid;
  vector<double,_std::allocator<double>_> phivals;
  SuttonChenAdapter sca;
  double local_128;
  double local_120;
  vector<double,_std::allocator<double>_> local_118;
  vector<double,_std::allocator<double>_> local_f8;
  double local_e0;
  RealType local_d8;
  uint local_cc;
  undefined1 local_c8 [16];
  vector<double,_std::allocator<double>_> local_b8;
  undefined4 local_9f;
  undefined3 uStack_9b;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  long local_70;
  double local_68;
  long local_60;
  _Base_ptr local_58;
  long local_50;
  size_t local_48;
  _Base_ptr local_40;
  SuttonChenAdapter local_38;
  
  local_88._8_8_ = local_88._0_8_;
  local_98._8_8_ = local_98._0_8_;
  local_c8._8_8_ = local_c8._0_8_;
  local_38.at_ = atomType;
  local_c8._0_8_ = SuttonChenAdapter::getC(&local_38);
  local_98._0_8_ = SuttonChenAdapter::getM(&local_38);
  local_d8 = SuttonChenAdapter::getN(&local_38);
  local_120 = SuttonChenAdapter::getAlpha(&local_38);
  local_88._0_8_ = SuttonChenAdapter::getEpsilon(&local_38);
  local_e0 = local_120 + local_120;
  local_cc = AtomType::getIdent(atomType);
  sVar2 = (this->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar9 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->SCtypes,(int *)&local_cc);
  if (pVar9.second == false) {
    snprintf(painCave.errMsg,2000,"SC already had a previous entry with ident %d\n",(ulong)local_cc)
    ;
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  iVar8 = (int)sVar2;
  (this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_cc] = iVar8;
  local_60 = (long)iVar8;
  pSVar3 = (this->SCdata).
           super__Vector_base<OpenMD::SCAtomData,_std::allocator<OpenMD::SCAtomData>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_50 = local_60 * 3;
  pSVar3[local_60].c = (RealType)local_c8._0_8_;
  pSVar3[local_60].m = (RealType)local_98._0_8_;
  pSVar3[local_60].n = local_d8;
  pSVar3[local_60].alpha = local_120;
  pSVar3[local_60].epsilon = (RealType)local_88._0_8_;
  pSVar3[local_60].rCut = local_e0;
  local_48 = sVar2;
  std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + local_60,(long)this->nSC_);
  local_40 = (this->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_58 = &(this->SCtypes)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_40 != local_58) {
    do {
      local_70 = (long)(this->SCtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(int)local_40[1]._M_color];
      atomType2 = ForceField::getAtomType(this->forceField_,local_40[1]._M_color);
      local_120 = getAlpha(this,atomType,atomType2);
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)atomType2;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)atomType;
      RVar5 = SuttonChenAdapter::getEpsilon((SuttonChenAdapter *)&local_f8);
      local_c8._0_8_ = RVar5;
      RVar5 = SuttonChenAdapter::getEpsilon((SuttonChenAdapter *)&local_118);
      dVar6 = RVar5 * (double)local_c8._0_8_;
      if (dVar6 < 0.0) {
        local_d8 = sqrt(dVar6);
      }
      else {
        local_d8 = SQRT(dVar6);
      }
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)atomType2;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)atomType;
      RVar5 = SuttonChenAdapter::getM((SuttonChenAdapter *)&local_f8);
      local_98._8_4_ = extraout_XMM0_Dc;
      local_98._0_8_ = RVar5;
      local_98._12_4_ = extraout_XMM0_Dd;
      RVar5 = SuttonChenAdapter::getM((SuttonChenAdapter *)&local_118);
      local_c8._8_4_ = extraout_XMM0_Dc_00;
      local_c8._0_8_ = RVar5;
      local_c8._12_4_ = extraout_XMM0_Dd_00;
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)atomType2;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)atomType;
      RVar5 = SuttonChenAdapter::getN((SuttonChenAdapter *)&local_f8);
      local_88._8_4_ = extraout_XMM0_Dc_01;
      local_88._0_8_ = RVar5;
      local_88._12_4_ = extraout_XMM0_Dd_01;
      RVar5 = SuttonChenAdapter::getN((SuttonChenAdapter *)&local_118);
      local_c8._8_8_ = (RVar5 + (double)local_88._0_8_) * 0.5;
      local_c8._0_8_ = ((double)local_c8._0_8_ + (double)local_98._0_8_) * 0.5;
      iVar8 = this->np_;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_128 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_f8,(iterator)0x0,&local_128);
      local_128 = 0.0;
      if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_118,
                   (iterator)
                   local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_128);
      }
      else {
        *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = 0.0;
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      local_128 = 0.0;
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_b8,
                   (iterator)
                   local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_128);
      }
      else {
        *local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = 0.0;
        local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      local_e0 = local_120 + local_120;
      local_98._8_4_ = local_c8._8_4_;
      local_98._0_8_ = local_c8._8_8_;
      local_98._12_4_ = local_c8._12_4_;
      if (1 < this->np_) {
        local_88._0_8_ = local_e0 / (double)(iVar8 + -1);
        iVar8 = 1;
        do {
          local_128 = (double)iVar8 * (double)local_88._0_8_;
          if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_f8,
                       (iterator)
                       local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_128);
          }
          else {
            *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = local_128;
            local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_68 = pow(local_120 / local_128,(double)local_98._0_8_);
          local_68 = local_68 * local_d8;
          if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&local_118,
                       (iterator)
                       local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_68);
          }
          else {
            *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = local_68;
            local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_68 = pow(local_120 / local_128,(double)local_c8._0_8_);
          if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_68);
          }
          else {
            *local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = local_68;
            local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < this->np_);
      }
      dVar6 = pow(local_120 / local_e0,(double)local_98._0_8_);
      local_98._0_8_ = dVar6;
      this_00 = (CubicSpline *)operator_new(0xa0);
      CubicSpline::CubicSpline(this_00);
      CubicSpline::addPoints(this_00,&local_f8,&local_118);
      this_01 = (CubicSpline *)operator_new(0xa0);
      CubicSpline::CubicSpline(this_01);
      CubicSpline::addPoints(this_01,&local_f8,&local_b8);
      lVar7 = local_70;
      std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::resize
                ((this->MixingMap).
                 super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_70,(long)this->nSC_);
      lVar4 = *(long *)((long)&(((this->MixingMap).
                                 super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                               )._M_impl.super__Vector_impl_data + local_50 * 8);
      *(double *)(lVar4 + local_70 * 0x48) = local_120;
      *(RealType *)(lVar4 + 8 + local_70 * 0x48) = local_d8;
      puVar1 = (undefined8 *)(lVar4 + 0x10 + local_70 * 0x48);
      *puVar1 = local_c8._0_8_;
      puVar1[1] = local_c8._8_8_;
      *(double *)(lVar4 + 0x20 + local_70 * 0x48) = local_e0;
      *(double *)(lVar4 + 0x28 + local_70 * 0x48) = (double)local_98._0_8_ * local_d8;
      *(CubicSpline **)(lVar4 + 0x30 + local_70 * 0x48) = this_00;
      *(CubicSpline **)(lVar4 + 0x38 + local_70 * 0x48) = this_01;
      *(undefined1 *)(lVar4 + 0x40 + local_70 * 0x48) = 0;
      *(undefined4 *)(lVar4 + 0x41 + local_70 * 0x48) = local_9f;
      *(uint *)(lVar4 + 0x44 + local_70 * 0x48) = CONCAT31(uStack_9b,local_9f._3_1_);
      if ((int)local_70 != (int)local_48) {
        lVar4 = *(long *)&(this->MixingMap).
                          super__Vector_base<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[lVar7].
                          super__Vector_base<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>
                          ._M_impl.super__Vector_impl_data;
        *(double *)(lVar4 + local_60 * 0x48) = local_120;
        *(RealType *)(lVar4 + 8 + local_60 * 0x48) = local_d8;
        puVar1 = (undefined8 *)(lVar4 + 0x10 + local_60 * 0x48);
        *puVar1 = local_c8._0_8_;
        puVar1[1] = local_c8._8_8_;
        *(double *)(lVar4 + 0x20 + local_60 * 0x48) = local_e0;
        *(double *)(lVar4 + 0x28 + local_60 * 0x48) = (double)local_98._0_8_ * local_d8;
        *(CubicSpline **)(lVar4 + 0x30 + local_60 * 0x48) = this_00;
        *(CubicSpline **)(lVar4 + 0x38 + local_60 * 0x48) = this_01;
        *(undefined1 *)(lVar4 + 0x40 + local_60 * 0x48) = 0;
        *(undefined4 *)(lVar4 + 0x41 + local_60 * 0x48) = local_9f;
        *(uint *)(lVar4 + 0x44 + local_60 * 0x48) = CONCAT31(uStack_9b,local_9f._3_1_);
      }
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      local_40 = (_Base_ptr)std::_Rb_tree_increment(local_40);
    } while (local_40 != local_58);
  }
  return;
}

Assistant:

void SC::addType(AtomType* atomType) {
    SuttonChenAdapter sca = SuttonChenAdapter(atomType);
    SCAtomData scAtomData;

    scAtomData.c       = sca.getC();
    scAtomData.m       = sca.getM();
    scAtomData.n       = sca.getN();
    scAtomData.alpha   = sca.getAlpha();
    scAtomData.epsilon = sca.getEpsilon();
    scAtomData.rCut    = 2.0 * scAtomData.alpha;

    // add it to the map:
    int atid  = atomType->getIdent();
    int sctid = SCtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = SCtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SC already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    SCtids[atid]  = sctid;
    SCdata[sctid] = scAtomData;
    MixingMap[sctid].resize(nSC_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = SCtypes.begin(); it != SCtypes.end(); ++it) {
      int sctid2       = SCtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      SCInteractionData mixer;

      mixer.alpha   = getAlpha(atomType, atype2);
      mixer.rCut    = 2.0 * mixer.alpha;
      mixer.epsilon = getEpsilon(atomType, atype2);
      mixer.m       = getM(atomType, atype2);
      mixer.n       = getN(atomType, atype2);

      RealType dr = mixer.rCut / (np_ - 1);
      vector<RealType> rvals;
      vector<RealType> vvals;
      vector<RealType> phivals;

      rvals.push_back(0.0);
      vvals.push_back(0.0);
      phivals.push_back(0.0);

      for (int k = 1; k < np_; k++) {
        RealType r = dr * k;
        rvals.push_back(r);
        vvals.push_back(mixer.epsilon * pow(mixer.alpha / r, mixer.n));
        phivals.push_back(pow(mixer.alpha / r, mixer.m));
      }

      mixer.vCut = mixer.epsilon * pow(mixer.alpha / mixer.rCut, mixer.n);

      CubicSpline* V = new CubicSpline();
      V->addPoints(rvals, vvals);

      CubicSpline* phi = new CubicSpline();
      phi->addPoints(rvals, phivals);

      mixer.V   = V;
      mixer.phi = phi;

      mixer.explicitlySet = false;

      MixingMap[sctid2].resize(nSC_);

      MixingMap[sctid][sctid2] = mixer;
      if (sctid2 != sctid) { MixingMap[sctid2][sctid] = mixer; }
    }
    return;
  }